

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

pthread_key_t
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey(void)

{
  pthread_key_t in_EAX;
  int iVar1;
  ostream *poVar2;
  pthread_key_t local_18;
  GTestLog local_14;
  pthread_key_t key;
  
  local_18 = in_EAX;
  iVar1 = pthread_key_create(&local_18,DeleteThreadLocalValue);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x706);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "pthread_key_create(&key, &DeleteThreadLocalValue)");
    poVar2 = std::operator<<(poVar2,"failed with error ");
    std::ostream::operator<<(poVar2,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  return local_18;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }